

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STPathSet.cpp
# Opt level: O0

Value __thiscall jbcoin::STPath::getJson(STPath *this,int param_1)

{
  bool bVar1;
  reference pSVar2;
  Value *pVVar3;
  jbcoin *pjVar4;
  undefined8 extraout_RDX;
  uint64_t uiHost;
  AccountID *account;
  Currency *currency;
  AccountID *account_00;
  undefined4 in_register_00000034;
  Value VVar5;
  string local_178;
  Value local_158;
  string local_148;
  Value local_128;
  string local_118;
  Value local_f8;
  string local_e8;
  Value local_c8;
  Value local_b8;
  uint local_a8;
  int iType;
  undefined1 local_98 [8];
  Value elem;
  STPathElement it;
  const_iterator __end1;
  const_iterator __begin1;
  vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> *__range1;
  int param_1_local;
  STPath *this_local;
  Value *ret;
  
  Json::Value::Value((Value *)this,arrayValue);
  __end1 = std::vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>::begin
                     ((vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> *)
                      CONCAT44(in_register_00000034,param_1));
  it.hash_value_ =
       (size_t)std::vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>::end
                         ((vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> *)
                          CONCAT44(in_register_00000034,param_1));
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_jbcoin::STPathElement_*,_std::vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>_>
                                     *)&it.hash_value_), bVar1) {
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_jbcoin::STPathElement_*,_std::vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>_>
             ::operator*(&__end1);
    it.mIssuerID.pn._12_8_ = *(undefined8 *)&pSVar2->is_offer_;
    it._64_8_ = pSVar2->hash_value_;
    elem._8_4_ = pSVar2->mType;
    elem._12_4_ = (pSVar2->mAccountID).pn[0];
    it.mType = (pSVar2->mAccountID).pn[1];
    it.mAccountID.pn[0] = (pSVar2->mAccountID).pn[2];
    it.mAccountID.pn._4_8_ = *(undefined8 *)((pSVar2->mAccountID).pn + 3);
    it.mAccountID.pn._12_8_ = *(undefined8 *)(pSVar2->mCurrencyID).pn;
    it.mCurrencyID.pn._0_8_ = *(undefined8 *)((pSVar2->mCurrencyID).pn + 2);
    it.mCurrencyID.pn._8_8_ = *(undefined8 *)((pSVar2->mCurrencyID).pn + 4);
    it.mCurrencyID.pn[4] = (pSVar2->mIssuerID).pn[1];
    it.mIssuerID.pn[0] = (pSVar2->mIssuerID).pn[2];
    it.mIssuerID.pn._4_8_ = *(undefined8 *)((pSVar2->mIssuerID).pn + 3);
    Json::Value::Value((Value *)local_98,objectValue);
    local_a8 = STPathElement::getNodeType((STPathElement *)&elem.field_0x8);
    Json::Value::Value(&local_b8,local_a8);
    pVVar3 = Json::Value::operator[]((Value *)local_98,(StaticString *)&jss::type);
    Json::Value::operator=(pVVar3,&local_b8);
    Json::Value::~Value(&local_b8);
    strHex_abi_cxx11_(&local_e8,(jbcoin *)(long)(int)local_a8,uiHost);
    Json::Value::Value(&local_c8,&local_e8);
    pVVar3 = Json::Value::operator[]((Value *)local_98,(StaticString *)&jss::type_hex);
    Json::Value::operator=(pVVar3,&local_c8);
    Json::Value::~Value(&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    if ((local_a8 & 1) != 0) {
      pjVar4 = (jbcoin *)STPathElement::getAccountID((STPathElement *)&elem.field_0x8);
      to_string_abi_cxx11_(&local_118,pjVar4,account);
      Json::Value::Value(&local_f8,&local_118);
      pVVar3 = Json::Value::operator[]((Value *)local_98,(StaticString *)&jss::account);
      Json::Value::operator=(pVVar3,&local_f8);
      Json::Value::~Value(&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
    }
    if ((local_a8 & 0x10) != 0) {
      pjVar4 = (jbcoin *)STPathElement::getCurrency((STPathElement *)&elem.field_0x8);
      to_string_abi_cxx11_(&local_148,pjVar4,currency);
      Json::Value::Value(&local_128,&local_148);
      pVVar3 = Json::Value::operator[]((Value *)local_98,(StaticString *)&jss::currency);
      Json::Value::operator=(pVVar3,&local_128);
      Json::Value::~Value(&local_128);
      std::__cxx11::string::~string((string *)&local_148);
    }
    if ((local_a8 & 0x20) != 0) {
      pjVar4 = (jbcoin *)STPathElement::getIssuerID((STPathElement *)&elem.field_0x8);
      to_string_abi_cxx11_(&local_178,pjVar4,account_00);
      Json::Value::Value(&local_158,&local_178);
      pVVar3 = Json::Value::operator[]((Value *)local_98,(StaticString *)&jss::issuer);
      Json::Value::operator=(pVVar3,&local_158);
      Json::Value::~Value(&local_158);
      std::__cxx11::string::~string((string *)&local_178);
    }
    Json::Value::append((Value *)this,(Value *)local_98);
    Json::Value::~Value((Value *)local_98);
    __gnu_cxx::
    __normal_iterator<const_jbcoin::STPathElement_*,_std::vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>_>
    ::operator++(&__end1);
  }
  VVar5._8_8_ = extraout_RDX;
  VVar5.value_.map_ = (ObjectValues *)this;
  return VVar5;
}

Assistant:

Json::Value
STPath::getJson (int) const
{
    Json::Value ret (Json::arrayValue);

    for (auto it: mPath)
    {
        Json::Value elem (Json::objectValue);
        int         iType   = it.getNodeType ();

        elem[jss::type]      = iType;
        elem[jss::type_hex]  = strHex (iType);

        if (iType & STPathElement::typeAccount)
            elem[jss::account]  = to_string (it.getAccountID ());

        if (iType & STPathElement::typeCurrency)
            elem[jss::currency] = to_string (it.getCurrency ());

        if (iType & STPathElement::typeIssuer)
            elem[jss::issuer]   = to_string (it.getIssuerID ());

        ret.append (elem);
    }

    return ret;
}